

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

void Abc_SclOneNodePrint(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  undefined8 *puVar11;
  float fVar12;
  
  iVar1 = pObj->Id;
  if ((long)iVar1 < 0) {
LAB_00457118:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pVVar3 = pObj->pNtk->vGates;
  if (pVVar3->nSize <= iVar1) goto LAB_00457118;
  uVar8 = pVVar3->pArray[iVar1];
  if ((ulong)uVar8 == 0xffffffff) {
    puVar11 = (undefined8 *)0x0;
  }
  else {
    if (((int)uVar8 < 0) ||
       (pvVar4 = pObj->pNtk->pSCLib, *(int *)((long)pvVar4 + 100) <= (int)uVar8)) goto LAB_00457137;
    puVar11 = *(undefined8 **)(*(long *)((long)pvVar4 + 0x68) + (ulong)uVar8 * 8);
  }
  pcVar10 = "Node";
  if ((pObj->vFanins).nSize == 0) {
    pcVar10 = " Inv";
  }
  printf("%s%7d :  ",pcVar10);
  iVar1 = (pObj->vFanins).nSize;
  printf("%d/%2d   ",(ulong)(iVar1 + (uint)(iVar1 == 0)),(ulong)(uint)(pObj->vFanouts).nSize);
  printf("%12s ",*puVar11);
  printf("(%2d/%2d)  ",(ulong)*(uint *)(puVar11 + 0xd),(ulong)*(uint *)((long)puVar11 + 0x6c));
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) &&
     (lVar5 = *(long *)((long)pObj->pNtk->pBSMan + 0x48), iVar1 < *(int *)(lVar5 + 4))) {
    iVar2 = *(int *)(puVar11 + 8);
    if ((long)iVar2 < 1) {
      fVar12 = 0.0;
    }
    else {
      uVar8 = 0;
      if (0 < (int)*(uint *)((long)puVar11 + 0x34)) {
        uVar8 = *(uint *)((long)puVar11 + 0x34);
      }
      if (uVar8 <= iVar2 - 1U) {
LAB_00457137:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      fVar12 = 0.0;
      lVar9 = 0;
      do {
        lVar6 = *(long *)(puVar11[7] + lVar9 * 8);
        fVar12 = fVar12 + *(float *)(lVar6 + 0x10) * 0.5 + *(float *)(lVar6 + 0x14) * 0.5;
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
    iVar7 = 1;
    if (1 < iVar2) {
      iVar7 = iVar2;
    }
    printf("gain =%5d  ",
           (ulong)(uint)(int)((*(float *)(*(long *)(lVar5 + 8) + (long)iVar1 * 4) * 100.0) /
                             (fVar12 / (float)iVar7)));
    iVar1 = pObj->Id;
    if ((-1 < (long)iVar1) &&
       (lVar5 = *(long *)((long)pObj->pNtk->pBSMan + 0x50), iVar1 < *(int *)(lVar5 + 4))) {
      printf("dept =%7.0f ps  ",(double)*(float *)(*(long *)(lVar5 + 8) + (long)iVar1 * 4));
      putchar(10);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

void Abc_SclOneNodePrint( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    SC_Cell * pCell = Abc_SclObjCell(pObj);
    printf( "%s%7d :  ",        (Abc_ObjFaninNum(pObj) == 0) ? " Inv" : "Node", Abc_ObjId(pObj) );
    printf( "%d/%2d   ",        Abc_ObjFaninNum(pObj) ? Abc_ObjFaninNum(pObj) : 1, Abc_ObjFanoutNum(pObj) );
    printf( "%12s ",            pCell->pName );
    printf( "(%2d/%2d)  ",      pCell->Order, pCell->nGates );
    printf( "gain =%5d  ",      (int)(100.0 * Bus_SclObjLoad(pObj) / SC_CellPinCapAve(pCell)) );
    printf( "dept =%7.0f ps  ", Bus_SclObjDept(pObj) );
    printf( "\n" );
}